

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyHttpImpl::QNetworkReplyHttpImpl
          (QNetworkReplyHttpImpl *this,QNetworkAccessManager *manager,QNetworkRequest *request,
          Operation *operation,QIODevice *outgoingData)

{
  QByteArrayView value;
  QByteArrayView defaultValue;
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  storage_type *psVar4;
  QNetworkReplyHttpImplPrivate *slot;
  QNetworkAccessManagerPrivate *pQVar5;
  element_type *peVar6;
  qint64 qVar7;
  qint64 qVar8;
  ulong uVar9;
  Operation *in_RCX;
  QNetworkRequest *in_RDX;
  QNetworkAccessManager *in_RSI;
  QFlags_conflict *in_RDI;
  QIODevice *in_R8;
  long in_FS_OFFSET;
  optional<long_long> oVar10;
  bool bufferingDisallowed;
  qint64 previousDataSize;
  QNetworkReplyHttpImplPrivate *d;
  optional<long_long> sizeOpt;
  QVariant synchronousHttpAttribute;
  QNetworkRequest *in_stack_fffffffffffffe18;
  code *__r;
  QLatin1StringView *in_stack_fffffffffffffe20;
  QNetworkReplyHttpImplPrivate *this_00;
  QNetworkReplyPrivate *in_stack_fffffffffffffe28;
  ConnectionType CVar11;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  WellKnownHeader name;
  QObject *in_stack_fffffffffffffe38;
  QNetworkRequest *pQVar12;
  QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_>
  *in_stack_fffffffffffffe48;
  void *in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe70 [16];
  undefined1 auVar13 [12];
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  QByteArrayView local_130 [4];
  code *local_e8;
  undefined8 local_e0;
  Connection local_d8;
  QLatin1StringView local_d0;
  QUrl local_c0 [4];
  QUrl local_a0;
  _Storage<long_long,_true> local_98;
  undefined8 local_90;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined8 local_10;
  long local_8;
  
  auVar13 = in_stack_fffffffffffffe70._4_12_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  psVar4 = (storage_type *)operator_new(0x448);
  QNetworkReplyHttpImplPrivate::QNetworkReplyHttpImplPrivate
            ((QNetworkReplyHttpImplPrivate *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  QNetworkReply::QNetworkReply
            ((QNetworkReply *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28,(QObject *)in_stack_fffffffffffffe20);
  *(undefined ***)in_RDI = &PTR_metaObject_0049eba0;
  slot = d_func((QNetworkReplyHttpImpl *)0x314aa7);
  slot->manager = in_RSI;
  pQVar5 = QNetworkAccessManager::d_func((QNetworkAccessManager *)0x314ad3);
  slot->managerPrivate = pQVar5;
  QNetworkRequest::operator=((QNetworkRequest *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
  ;
  QNetworkRequest::operator=((QNetworkRequest *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
  ;
  (slot->super_QNetworkReplyPrivate).operation = *in_RCX;
  slot->outgoingData = in_R8;
  QNetworkRequest::url((QNetworkRequest *)in_stack_fffffffffffffe28);
  QUrl::operator=((QUrl *)in_stack_fffffffffffffe20,(QUrl *)in_stack_fffffffffffffe18);
  QUrl::~QUrl(&local_a0);
  QNetworkRequest::url((QNetworkRequest *)in_stack_fffffffffffffe28);
  QUrl::scheme();
  local_d0 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
  bVar1 = ::operator==((QString *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  QString::~QString((QString *)0x314bfb);
  QUrl::~QUrl(local_c0);
  if (bVar1) {
    in_stack_fffffffffffffe48 = &slot->sslConfiguration;
    in_stack_fffffffffffffe50 = operator_new(8);
    QNetworkRequest::sslConfiguration((QNetworkRequest *)in_stack_fffffffffffffe38);
    QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_>::reset
              ((QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_> *)
               in_stack_fffffffffffffe20,(QSslConfiguration *)in_stack_fffffffffffffe28);
  }
  local_e8 = QNetworkReplyHttpImplPrivate::followRedirect;
  local_e0 = 0;
  __r = QNetworkReplyHttpImplPrivate::followRedirect;
  this_00 = (QNetworkReplyHttpImplPrivate *)0x0;
  QObjectPrivate::connect<void(QNetworkReply::*)(),void(QNetworkReplyHttpImplPrivate::*)()>
            ((Object *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (offset_in_QNetworkReply_to_subr)in_RCX,auVar13._4_8_,(Function)slot,auVar13._0_4_);
  QMetaObject::Connection::~Connection(&local_d8);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,(OpenModeFlag)((ulong)__r >> 0x20));
  QIODevice::open(in_RDI);
  local_28.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_28._8_8_ = 0xaaaaaaaaaaaaaaaa;
  local_28._16_8_ = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  pQVar12 = in_RDX;
  QVariant::QVariant((QVariant *)0x314d51);
  QNetworkRequest::attribute
            ((QNetworkRequest *)in_stack_fffffffffffffe28,
             (Attribute)((ulong)in_stack_fffffffffffffe38 >> 0x20),(QVariant *)this_00);
  CVar11 = (ConnectionType)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  QVariant::~QVariant(&local_48);
  bVar1 = QVariant::isValid((QVariant *)this_00);
  if (bVar1) {
    bVar2 = QVariant::toBool();
    slot->synchronous = (bool)(bVar2 & 1);
    if (((slot->synchronous & 1U) != 0) && (in_R8 != (QIODevice *)0x0)) {
      std::make_shared<QRingBuffer>();
      std::shared_ptr<QRingBuffer>::operator=
                ((shared_ptr<QRingBuffer> *)this_00,(shared_ptr<QRingBuffer> *)__r);
      std::shared_ptr<QRingBuffer>::~shared_ptr((shared_ptr<QRingBuffer> *)0x314e0d);
      do {
        peVar6 = std::__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x314e2a);
        qVar7 = QRingBuffer::size(peVar6);
        peVar6 = std::__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x314e4b);
        QIODevice::readAll();
        QRingBuffer::append((QByteArray *)peVar6);
        QByteArray::~QByteArray((QByteArray *)0x314e8b);
        peVar6 = std::__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x314e9f);
        qVar8 = QRingBuffer::size(peVar6);
      } while (qVar8 != qVar7);
      QNetworkReplyHttpImplPrivate::_q_startOperation(this_00);
      goto LAB_003150b9;
    }
  }
  if (in_R8 == (QIODevice *)0x0) {
    QNetworkReplyHttpImplPrivate::_q_startOperation(this_00);
  }
  else {
    uVar9 = (**(code **)(*(long *)slot->outgoingData + 0x60))();
    if ((uVar9 & 1) == 0) {
      QMetaObject::invokeMethod<>
                (in_stack_fffffffffffffe38,
                 (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),CVar11);
    }
    else {
      QVariant::QVariant(&local_88,false);
      QNetworkRequest::attribute
                (in_RDX,(Attribute)((ulong)in_stack_fffffffffffffe38 >> 0x20),(QVariant *)this_00);
      uVar3 = QVariant::toBool();
      name = CONCAT13(uVar3,(int3)in_stack_fffffffffffffe34);
      QVariant::~QVariant(&local_68);
      QVariant::~QVariant(&local_88);
      if ((name & 0x1000000) == AIM) {
        slot->state = Buffering;
        QMetaObject::invokeMethod<>
                  (in_stack_fffffffffffffe38,(char *)CONCAT44(name,in_stack_fffffffffffffe30),
                   (ConnectionType)((ulong)in_RDX >> 0x20));
      }
      else {
        local_98 = (_Storage<long_long,_true>)0xaaaaaaaaaaaaaaaa;
        local_90 = 0xaaaaaaaaaaaaaaaa;
        QNetworkRequest::headers(in_RDX);
        CVar11 = (ConnectionType)((ulong)in_RDX >> 0x20);
        QByteArrayView::QByteArrayView(local_130);
        defaultValue.m_data = psVar4;
        defaultValue.m_size = (qsizetype)in_stack_fffffffffffffe50;
        QHttpHeaders::value((QHttpHeaders *)in_stack_fffffffffffffe38,name,defaultValue);
        value.m_data = (storage_type *)in_stack_fffffffffffffe48;
        value.m_size = (qsizetype)pQVar12;
        oVar10 = QNetworkHeadersPrivate::toInt(value);
        local_98._M_value =
             oVar10.super__Optional_base<long_long,_true,_true>._M_payload.
             super__Optional_payload_base<long_long>._M_payload;
        local_90 = CONCAT71(local_90._1_7_,
                            oVar10.super__Optional_base<long_long,_true,_true>._M_payload.
                            super__Optional_payload_base<long_long>._M_engaged);
        QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x315023);
        bVar1 = std::optional::operator_cast_to_bool((optional<long_long> *)0x315030);
        if (bVar1) {
          QMetaObject::invokeMethod<>
                    (in_stack_fffffffffffffe38,(char *)CONCAT44(name,in_stack_fffffffffffffe30),
                     CVar11);
        }
        else {
          slot->state = Buffering;
          QMetaObject::invokeMethod<>
                    (in_stack_fffffffffffffe38,(char *)CONCAT44(name,in_stack_fffffffffffffe30),
                     CVar11);
        }
      }
    }
  }
LAB_003150b9:
  QVariant::~QVariant((QVariant *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QNetworkReplyHttpImpl::QNetworkReplyHttpImpl(QNetworkAccessManager* const manager,
                                             const QNetworkRequest& request,
                                             QNetworkAccessManager::Operation& operation,
                                             QIODevice* outgoingData)
    : QNetworkReply(*new QNetworkReplyHttpImplPrivate, manager)
{
    Q_D(QNetworkReplyHttpImpl);
    Q_ASSERT(manager);
    d->manager = manager;
    d->managerPrivate = manager->d_func();
    d->request = request;
    d->originalRequest = request;
    d->operation = operation;
    d->outgoingData = outgoingData;
    d->url = request.url();
#ifndef QT_NO_SSL
    if (request.url().scheme() == "https"_L1)
        d->sslConfiguration.reset(new QSslConfiguration(request.sslConfiguration()));
#endif

    QObjectPrivate::connect(this, &QNetworkReplyHttpImpl::redirectAllowed, d,
            &QNetworkReplyHttpImplPrivate::followRedirect, Qt::QueuedConnection);

    // FIXME Later maybe set to Unbuffered, especially if it is zerocopy or from cache?
    QIODevice::open(QIODevice::ReadOnly);


    // Internal code that does a HTTP reply for the synchronous Ajax
    // in Qt WebKit.
    QVariant synchronousHttpAttribute = request.attribute(
            static_cast<QNetworkRequest::Attribute>(QNetworkRequest::SynchronousRequestAttribute));
    if (synchronousHttpAttribute.isValid()) {
        d->synchronous = synchronousHttpAttribute.toBool();
        if (d->synchronous && outgoingData) {
            // The synchronous HTTP is a corner case, we will put all upload data in one big QByteArray in the outgoingDataBuffer.
            // Yes, this is not the most efficient thing to do, but on the other hand synchronous XHR needs to die anyway.
            d->outgoingDataBuffer = std::make_shared<QRingBuffer>();
            qint64 previousDataSize = 0;
            do {
                previousDataSize = d->outgoingDataBuffer->size();
                d->outgoingDataBuffer->append(d->outgoingData->readAll());
            } while (d->outgoingDataBuffer->size() != previousDataSize);
            d->_q_startOperation();
            return;
        }
    }


    if (outgoingData) {
        // there is data to be uploaded, e.g. HTTP POST.

        if (!d->outgoingData->isSequential()) {
            // fixed size non-sequential (random-access)
            // just start the operation
            QMetaObject::invokeMethod(this, "_q_startOperation", Qt::QueuedConnection);
            // FIXME make direct call?
        } else {
            bool bufferingDisallowed =
                    request.attribute(QNetworkRequest::DoNotBufferUploadDataAttribute,
                                  false).toBool();

            if (bufferingDisallowed) {
                // if a valid content-length header for the request was supplied, we can disable buffering
                // if not, we will buffer anyway

                const auto sizeOpt = QNetworkHeadersPrivate::toInt(
                        request.headers().value(QHttpHeaders::WellKnownHeader::ContentLength));
                 if (sizeOpt) {
                    QMetaObject::invokeMethod(this, "_q_startOperation", Qt::QueuedConnection);
                    // FIXME make direct call?
                } else {
                    d->state = d->Buffering;
                    QMetaObject::invokeMethod(this, "_q_bufferOutgoingData", Qt::QueuedConnection);
                }
            } else {
                // _q_startOperation will be called when the buffering has finished.
                d->state = d->Buffering;
                QMetaObject::invokeMethod(this, "_q_bufferOutgoingData", Qt::QueuedConnection);
            }
        }
    } else {
        // No outgoing data (POST, ..)
        d->_q_startOperation();
    }
}